

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeApplicationStateInfo::ChromeApplicationStateInfo
          (ChromeApplicationStateInfo *this)

{
  ChromeApplicationStateInfo *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ChromeApplicationStateInfo_009c1b20;
  this->application_state_ =
       ChromeApplicationStateInfo_ChromeApplicationState_APPLICATION_STATE_UNKNOWN;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<2UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

ChromeApplicationStateInfo::ChromeApplicationStateInfo() = default;